

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

void Abc_NtkCecFraigPart(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nPartSize,int fVerbose)

{
  uint *puVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pMiter;
  int *piVar5;
  Abc_Frame_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pAVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  size_t __size;
  Abc_Ntk_t *pMiterPart;
  Prove_Params_t Params;
  int local_9c;
  Abc_Ntk_t *local_98;
  Abc_Ntk_t *local_90;
  Prove_Params_t local_88;
  
  Prove_ParamsSetDefault(&local_88);
  local_88.nItersMax = 5;
  if (nPartSize < 1) {
    __assert_fail("nPartSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x10b,"void Abc_NtkCecFraigPart(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
  }
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,nPartSize,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar3 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar3 == 1) {
    pcVar9 = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar3 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      __size = (long)pMiter->vCis->nSize << 2;
      piVar5 = (int *)malloc(__size);
      memset(piVar5,0,__size);
      pMiter->pModel = piVar5;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar5);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_0031fd38;
    }
    uVar10 = 0;
    local_90 = pNtk1;
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,"unset progressbar");
    pVVar7 = pMiter->vPos;
    if (pVVar7->nSize < 1) {
      local_9c = 1;
    }
    else {
      local_9c = 1;
      lVar11 = 0;
      uVar10 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar7->pArray[lVar11];
        pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        pAVar8 = Abc_AigConst1(pMiter);
        if (pAVar2 == pAVar8) {
          uVar4 = *(uint *)&pObj->field_0x14 >> 10 & 1;
          local_98 = (Abc_Ntk_t *)0x0;
        }
        else {
          pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          pcVar9 = Abc_ObjName(pObj);
          local_98 = Abc_NtkCreateCone(pMiter,pAVar2,pcVar9,0);
          if ((pObj->field_0x15 & 4) != 0) {
            if (local_98->vPos->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)*local_98->vPos->pArray + 0x14);
            *puVar1 = *puVar1 ^ 0x400;
          }
          uVar4 = Abc_NtkIvyProve(&local_98,&local_88);
        }
        if (uVar4 == 0xffffffff) {
          printf("Networks are undecided (resource limits is reached).\r");
          local_9c = -1;
        }
        else {
          if (uVar4 == 0) {
            piVar5 = Abc_NtkVerifySimulatePattern(local_98,local_98->pModel);
            pcVar9 = "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.";
            if (*piVar5 == 1) {
              pcVar9 = "Networks are NOT EQUIVALENT.                 ";
            }
            puts(pcVar9);
            free(piVar5);
            local_9c = 0;
            break;
          }
          printf("Finished part %5d (out of %5d)\r",(ulong)((int)lVar11 + 1),
                 (ulong)(uint)pMiter->vPos->nSize);
          uVar10 = uVar10 + nPartSize;
        }
        if (local_98 != (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(local_98);
        }
        lVar11 = lVar11 + 1;
        pVVar7 = pMiter->vPos;
      } while (lVar11 < pVVar7->nSize);
    }
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,"set progressbar");
    if (local_9c == -1) {
      printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)uVar10,
             (ulong)(uint)local_90->vCos->nSize);
      goto LAB_0031fd38;
    }
    if (local_9c != 1) goto LAB_0031fd38;
    pcVar9 = "Networks are equivalent.                         ";
  }
  puts(pcVar9);
LAB_0031fd38:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    Abc_Obj_t * pObj;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    assert( nPartSize > 0 );

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, nPartSize, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // solve the problem iteratively for each output of the miter
    Status = 1;
    nOutputs = 0;
    Abc_NtkForEachPo( pMiter, pObj, i )
    {
        if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pMiter) )
        {
            if ( Abc_ObjFaninC0(pObj) ) // complemented -> const 0
                RetValue = 1;
            else
                RetValue = 0;
            pMiterPart = NULL;
        }
        else
        {
            // get the cone of this output
            pMiterPart = Abc_NtkCreateCone( pMiter, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 0 );
            if ( Abc_ObjFaninC0(pObj) )
                Abc_ObjXorFaninC( Abc_NtkPo(pMiterPart,0), 0 );
            // solve the cone
        //    RetValue = Abc_NtkMiterProve( &pMiterPart, pParams );
            RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        }

        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            break;
        }
        else
        {
            printf( "Finished part %5d (out of %5d)\r", i+1, Abc_NtkPoNum(pMiter) );
            nOutputs += nPartSize;
        }
//        if ( pMiter->pModel )
//            Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        if ( pMiterPart )
            Abc_NtkDelete( pMiterPart );
    }
  
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}